

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::sse42::
     BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::sse42::ArrayIntersectorK_1<4,_embree::sse42::InstanceArrayIntersectorK<4>_>,_false>
     ::intersectCoherent(vint<4> *valid_i,Intersectors *This,RayHitK<4> *ray,
                        RayQueryContext *context)

{
  StackItemT<embree::NodeRefPtr<4>_> *pSVar1;
  StackItemT<embree::NodeRefPtr<4>_> *pSVar2;
  StackItemT<embree::NodeRefPtr<4>_> *pSVar3;
  float *pfVar4;
  StackItemT<embree::NodeRefPtr<4>_> SVar5;
  AccelData *pAVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [12];
  undefined4 in_EAX;
  uint uVar16;
  int iVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  long lVar21;
  undefined4 uVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  ulong uVar26;
  ulong uVar27;
  ulong uVar28;
  NodeRef nodeRef;
  Primitive_conflict4 *prim;
  StackItemT<embree::NodeRefPtr<4>_> *pSVar29;
  bool bVar30;
  undefined1 auVar31 [16];
  float fVar52;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  float fVar53;
  uint uVar54;
  float fVar62;
  float fVar64;
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  uint uVar63;
  uint uVar65;
  float fVar66;
  uint uVar67;
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  float fVar68;
  uint uVar69;
  float fVar76;
  float fVar78;
  vint4 bi;
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  uint uVar77;
  uint uVar79;
  float fVar80;
  uint uVar81;
  undefined1 auVar75 [16];
  vint4 bi_1;
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  float fVar90;
  float fVar91;
  float fVar97;
  float fVar98;
  vint4 ai;
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  float fVar99;
  undefined1 auVar96 [16];
  float fVar100;
  float fVar103;
  float fVar104;
  float fVar105;
  float fVar106;
  vint4 ai_1;
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  float fVar107;
  float fVar108;
  float fVar109;
  float fVar111;
  float fVar112;
  vint4 ai_3;
  undefined1 auVar110 [16];
  float fVar113;
  float fVar114;
  float fVar115;
  float fVar118;
  float fVar119;
  float fVar120;
  float fVar121;
  vint4 bi_4;
  float fVar122;
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  uint uVar125;
  uint uVar126;
  vint4 bi_3;
  undefined1 auVar123 [16];
  uint uVar127;
  undefined1 auVar124 [16];
  uint uVar128;
  uint uVar131;
  uint uVar132;
  vint4 ai_2;
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  uint uVar133;
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  float fVar136;
  float fVar137;
  float fVar138;
  float fVar139;
  float fVar140;
  float fVar141;
  float fVar142;
  float fVar143;
  float fVar144;
  float fVar145;
  float fVar146;
  float fVar147;
  undefined1 auVar148 [16];
  Precalculations pre;
  vbool<4> valid_leaf;
  vint4 bi_8;
  float local_1148;
  float fStack_1144;
  float fStack_1140;
  int local_1138;
  int iStack_1134;
  int iStack_1130;
  int iStack_112c;
  undefined1 local_10d8 [16];
  undefined1 local_10c8 [16];
  undefined1 local_10b8 [16];
  undefined1 local_10a8 [16];
  undefined1 local_1098 [16];
  float local_1088;
  float fStack_1084;
  float fStack_1080;
  float fStack_107c;
  float local_1078;
  float fStack_1074;
  float fStack_1070;
  float fStack_106c;
  float local_1068;
  float fStack_1064;
  float fStack_1060;
  float fStack_105c;
  float local_1058;
  float fStack_1054;
  float fStack_1050;
  float fStack_104c;
  float local_1048;
  float fStack_1044;
  float fStack_1040;
  float fStack_103c;
  float local_1038;
  float fStack_1034;
  float fStack_1030;
  float fStack_102c;
  float local_1028;
  float fStack_1024;
  float fStack_1020;
  float fStack_101c;
  float local_1018;
  float fStack_1014;
  float fStack_1010;
  float fStack_100c;
  float local_1008;
  float fStack_1004;
  float fStack_1000;
  float fStack_ffc;
  float local_ff8;
  float fStack_ff4;
  float fStack_ff0;
  float fStack_fec;
  float local_fe8;
  float fStack_fe4;
  float fStack_fe0;
  float fStack_fdc;
  float local_fd8;
  float fStack_fd4;
  float fStack_fd0;
  float fStack_fcc;
  float local_fc8;
  float fStack_fc4;
  float fStack_fc0;
  float fStack_fbc;
  undefined1 local_fb8 [8];
  float fStack_fb0;
  float fStack_fac;
  undefined1 local_fa8 [16];
  float local_f98;
  float fStack_f94;
  float fStack_f90;
  float fStack_f8c;
  vfloat<4> fmin;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  
  auVar72._8_4_ = 0xffffffff;
  auVar72._0_8_ = 0xffffffffffffffff;
  auVar72._12_4_ = 0xffffffff;
  auVar70._0_4_ = -(uint)((valid_i->field_0).i[0] == -1);
  auVar70._4_4_ = -(uint)((valid_i->field_0).i[1] == -1);
  auVar70._8_4_ = -(uint)((valid_i->field_0).i[2] == -1);
  auVar70._12_4_ = -(uint)((valid_i->field_0).i[3] == -1);
  uVar16 = movmskps(in_EAX,auVar70);
  if (uVar16 == 0) {
    return;
  }
  pAVar6 = This->ptr;
  uVar23 = (ulong)(uVar16 & 0xff);
  fVar136 = *(float *)ray;
  fVar137 = *(float *)(ray + 4);
  fVar138 = *(float *)(ray + 8);
  fVar139 = *(float *)(ray + 0xc);
  fVar140 = *(float *)(ray + 0x10);
  fVar141 = *(float *)(ray + 0x14);
  fVar142 = *(float *)(ray + 0x18);
  fVar143 = *(float *)(ray + 0x1c);
  fVar144 = *(float *)(ray + 0x20);
  fVar145 = *(float *)(ray + 0x24);
  fVar146 = *(float *)(ray + 0x28);
  fVar147 = *(float *)(ray + 0x2c);
  auVar73 = *(undefined1 (*) [16])(ray + 0x40);
  fVar114 = (float)DAT_01f4bd50;
  fVar118 = DAT_01f4bd50._4_4_;
  fVar120 = DAT_01f4bd50._8_4_;
  fVar122 = DAT_01f4bd50._12_4_;
  auVar89._4_4_ = -(uint)(ABS(auVar73._4_4_) < fVar118);
  auVar89._0_4_ = -(uint)(ABS(auVar73._0_4_) < fVar114);
  auVar89._8_4_ = -(uint)(ABS(auVar73._8_4_) < fVar120);
  auVar89._12_4_ = -(uint)(ABS(auVar73._12_4_) < fVar122);
  auVar123 = blendvps(auVar73,_DAT_01f4bd50,auVar89);
  auVar89 = *(undefined1 (*) [16])(ray + 0x50);
  auVar93._4_4_ = -(uint)(ABS(auVar89._4_4_) < fVar118);
  auVar93._0_4_ = -(uint)(ABS(auVar89._0_4_) < fVar114);
  auVar93._8_4_ = -(uint)(ABS(auVar89._8_4_) < fVar120);
  auVar93._12_4_ = -(uint)(ABS(auVar89._12_4_) < fVar122);
  auVar129 = blendvps(auVar89,_DAT_01f4bd50,auVar93);
  auVar93 = *(undefined1 (*) [16])(ray + 0x60);
  auVar148._4_4_ = -(uint)(ABS(auVar93._4_4_) < fVar118);
  auVar148._0_4_ = -(uint)(ABS(auVar93._0_4_) < fVar114);
  auVar148._8_4_ = -(uint)(ABS(auVar93._8_4_) < fVar120);
  auVar148._12_4_ = -(uint)(ABS(auVar93._12_4_) < fVar122);
  auVar134 = blendvps(auVar93,_DAT_01f4bd50,auVar148);
  auVar31 = rcpps(auVar148,auVar123);
  fVar114 = auVar31._0_4_;
  fVar118 = auVar31._4_4_;
  fVar53 = auVar31._8_4_;
  fVar52 = auVar31._12_4_;
  auVar135._4_4_ = (1.0 - auVar123._4_4_ * fVar118) * fVar118 + fVar118;
  auVar135._0_4_ = (1.0 - auVar123._0_4_ * fVar114) * fVar114 + fVar114;
  auVar31 = rcpps(auVar31,auVar129);
  fVar114 = auVar31._0_4_;
  fVar118 = auVar31._4_4_;
  fVar120 = auVar31._8_4_;
  fVar122 = auVar31._12_4_;
  local_10a8._0_8_ =
       CONCAT44((1.0 - auVar129._4_4_ * fVar118) * fVar118 + fVar118,
                (1.0 - auVar129._0_4_ * fVar114) * fVar114 + fVar114);
  local_10a8._8_4_ = (1.0 - auVar129._8_4_ * fVar120) * fVar120 + fVar120;
  local_10a8._12_4_ = (1.0 - auVar129._12_4_ * fVar122) * fVar122 + fVar122;
  auVar31 = rcpps(auVar31,auVar134);
  fVar114 = auVar31._0_4_;
  fVar118 = auVar31._4_4_;
  fVar120 = auVar31._8_4_;
  fVar122 = auVar31._12_4_;
  auVar135._8_4_ = (1.0 - auVar123._8_4_ * fVar53) * fVar53 + fVar53;
  auVar135._12_4_ = (1.0 - auVar123._12_4_ * fVar52) * fVar52 + fVar52;
  fVar114 = (1.0 - auVar134._0_4_ * fVar114) * fVar114 + fVar114;
  fVar118 = (1.0 - auVar134._4_4_ * fVar118) * fVar118 + fVar118;
  fVar120 = (1.0 - auVar134._8_4_ * fVar120) * fVar120 + fVar120;
  fVar122 = (1.0 - auVar134._12_4_ * fVar122) * fVar122 + fVar122;
  auVar123._0_12_ = ZEXT812(0);
  auVar123._12_4_ = 0;
  auVar148 = maxps(*(undefined1 (*) [16])(ray + 0x30),auVar123);
  auVar31._8_4_ = local_10a8._8_4_;
  auVar31._0_8_ = local_10a8._0_8_;
  auVar31._12_4_ = local_10a8._12_4_;
  auVar129._0_8_ = CONCAT44(-(uint)(auVar73._4_4_ < 0.0),-(uint)(auVar73._0_4_ < 0.0)) & 0x100000001
  ;
  auVar129._8_4_ = -(uint)(auVar73._8_4_ < 0.0) & 1;
  auVar129._12_4_ = -(uint)(auVar73._12_4_ < 0.0) & 1;
  local_10b8 = maxps(*(undefined1 (*) [16])(ray + 0x80),auVar123);
  auVar73._0_8_ = CONCAT44(-(uint)(auVar89._4_4_ < 0.0),-(uint)(auVar89._0_4_ < 0.0)) & 0x200000002;
  auVar73._8_4_ = -(uint)(auVar89._8_4_ < 0.0) & 2;
  auVar73._12_4_ = -(uint)(auVar89._12_4_ < 0.0) & 2;
  auVar134._0_8_ = CONCAT44(-(uint)(auVar93._4_4_ < 0.0),-(uint)(auVar93._0_4_ < 0.0)) & 0x400000004
  ;
  auVar134._8_4_ = -(uint)(auVar93._8_4_ < 0.0) & 4;
  auVar134._12_4_ = -(uint)(auVar93._12_4_ < 0.0) & 4;
  local_10c8 = auVar70 ^ auVar72 | auVar134 | auVar73 | auVar129;
  local_1058 = fVar136;
  fStack_1054 = fVar137;
  fStack_1050 = fVar138;
  fStack_104c = fVar139;
  local_1068 = fVar140;
  fStack_1064 = fVar141;
  fStack_1060 = fVar142;
  fStack_105c = fVar143;
  local_1078 = fVar144;
  fStack_1074 = fVar145;
  fStack_1070 = fVar146;
  fStack_106c = fVar147;
  local_1088 = fVar114;
  fStack_1084 = fVar118;
  fStack_1080 = fVar120;
  fStack_107c = fVar122;
  local_1098 = auVar135;
LAB_007325d9:
  lVar21 = 0;
  if (uVar23 != 0) {
    for (; (uVar23 >> lVar21 & 1) == 0; lVar21 = lVar21 + 1) {
    }
  }
  iVar17 = *(int *)(local_10c8 + lVar21 * 4);
  auVar32._0_8_ = CONCAT44(-(uint)(iVar17 == local_10c8._4_4_),-(uint)(iVar17 == local_10c8._0_4_));
  auVar32._8_4_ = -(uint)(iVar17 == local_10c8._8_4_);
  auVar32._12_4_ = -(uint)(iVar17 == local_10c8._12_4_);
  uVar22 = movmskps((int)lVar21,auVar32);
  uVar23 = ~CONCAT44((int)((ulong)lVar21 >> 0x20),uVar22) & uVar23;
  auVar7._4_4_ = fVar137;
  auVar7._0_4_ = fVar136;
  auVar7._8_4_ = fVar138;
  auVar7._12_4_ = fVar139;
  auVar70 = blendvps(_DAT_01f45a30,auVar7,auVar32);
  auVar55._4_4_ = auVar70._0_4_;
  auVar55._0_4_ = auVar70._4_4_;
  auVar55._8_4_ = auVar70._12_4_;
  auVar55._12_4_ = auVar70._8_4_;
  auVar70 = minps(auVar55,auVar70);
  auVar71._0_8_ = auVar70._8_8_;
  auVar71._8_4_ = auVar70._0_4_;
  auVar71._12_4_ = auVar70._4_4_;
  auVar72 = minps(auVar71,auVar70);
  auVar9._4_4_ = fVar141;
  auVar9._0_4_ = fVar140;
  auVar9._8_4_ = fVar142;
  auVar9._12_4_ = fVar143;
  auVar70 = blendvps(_DAT_01f45a30,auVar9,auVar32);
  auVar56._4_4_ = auVar70._0_4_;
  auVar56._0_4_ = auVar70._4_4_;
  auVar56._8_4_ = auVar70._12_4_;
  auVar56._12_4_ = auVar70._8_4_;
  auVar70 = minps(auVar56,auVar70);
  auVar82._0_8_ = auVar70._8_8_;
  auVar82._8_4_ = auVar70._0_4_;
  auVar82._12_4_ = auVar70._4_4_;
  auVar70 = minps(auVar82,auVar70);
  auVar72 = insertps(auVar72,auVar70,0x1c);
  auVar11._4_4_ = fVar145;
  auVar11._0_4_ = fVar144;
  auVar11._8_4_ = fVar146;
  auVar11._12_4_ = fVar147;
  auVar70 = blendvps(_DAT_01f45a30,auVar11,auVar32);
  auVar57._4_4_ = auVar70._0_4_;
  auVar57._0_4_ = auVar70._4_4_;
  auVar57._8_4_ = auVar70._12_4_;
  auVar57._12_4_ = auVar70._8_4_;
  auVar70 = minps(auVar57,auVar70);
  auVar83._0_8_ = auVar70._8_8_;
  auVar83._8_4_ = auVar70._0_4_;
  auVar83._12_4_ = auVar70._4_4_;
  auVar70 = minps(auVar83,auVar70);
  auVar73 = insertps(auVar72,auVar70,0x20);
  auVar8._4_4_ = fVar137;
  auVar8._0_4_ = fVar136;
  auVar8._8_4_ = fVar138;
  auVar8._12_4_ = fVar139;
  auVar70 = blendvps(_DAT_01f45a40,auVar8,auVar32);
  auVar92._4_4_ = auVar70._0_4_;
  auVar92._0_4_ = auVar70._4_4_;
  auVar92._8_4_ = auVar70._12_4_;
  auVar92._12_4_ = auVar70._8_4_;
  auVar70 = maxps(auVar92,auVar70);
  auVar84._0_8_ = auVar70._8_8_;
  auVar84._8_4_ = auVar70._0_4_;
  auVar84._12_4_ = auVar70._4_4_;
  auVar72 = maxps(auVar84,auVar70);
  auVar101._8_4_ = auVar32._8_4_;
  auVar101._0_8_ = auVar32._0_8_;
  auVar101._12_4_ = auVar32._12_4_;
  auVar10._4_4_ = fVar141;
  auVar10._0_4_ = fVar140;
  auVar10._8_4_ = fVar142;
  auVar10._12_4_ = fVar143;
  auVar70 = blendvps(_DAT_01f45a40,auVar10,auVar32);
  auVar33._4_4_ = auVar70._0_4_;
  auVar33._0_4_ = auVar70._4_4_;
  auVar33._8_4_ = auVar70._12_4_;
  auVar33._12_4_ = auVar70._8_4_;
  auVar70 = maxps(auVar33,auVar70);
  auVar85._0_8_ = auVar70._8_8_;
  auVar85._8_4_ = auVar70._0_4_;
  auVar85._12_4_ = auVar70._4_4_;
  auVar70 = maxps(auVar85,auVar70);
  auVar72 = insertps(auVar72,auVar70,0x1c);
  auVar34._8_4_ = auVar32._8_4_;
  auVar34._0_8_ = auVar32._0_8_;
  auVar34._12_4_ = auVar32._12_4_;
  auVar12._4_4_ = fVar145;
  auVar12._0_4_ = fVar144;
  auVar12._8_4_ = fVar146;
  auVar12._12_4_ = fVar147;
  auVar70 = blendvps(_DAT_01f45a40,auVar12,auVar34);
  auVar35._4_4_ = auVar70._0_4_;
  auVar35._0_4_ = auVar70._4_4_;
  auVar35._8_4_ = auVar70._12_4_;
  auVar35._12_4_ = auVar70._8_4_;
  auVar70 = maxps(auVar35,auVar70);
  auVar86._0_8_ = auVar70._8_8_;
  auVar86._8_4_ = auVar70._0_4_;
  auVar86._12_4_ = auVar70._4_4_;
  auVar70 = maxps(auVar86,auVar70);
  auVar93 = insertps(auVar72,auVar70,0x20);
  auVar36._8_4_ = auVar32._8_4_;
  auVar36._0_8_ = auVar32._0_8_;
  auVar36._12_4_ = auVar32._12_4_;
  auVar70 = blendvps(_DAT_01f45a30,auVar135,auVar36);
  auVar37._4_4_ = auVar70._0_4_;
  auVar37._0_4_ = auVar70._4_4_;
  auVar37._8_4_ = auVar70._12_4_;
  auVar37._12_4_ = auVar70._8_4_;
  auVar70 = minps(auVar37,auVar70);
  auVar130._0_8_ = auVar70._8_8_;
  auVar130._8_4_ = auVar70._0_4_;
  auVar130._12_4_ = auVar70._4_4_;
  auVar72 = minps(auVar130,auVar70);
  auVar38._8_4_ = auVar32._8_4_;
  auVar38._0_8_ = auVar32._0_8_;
  auVar38._12_4_ = auVar32._12_4_;
  auVar70 = blendvps(_DAT_01f45a30,auVar31,auVar38);
  auVar39._4_4_ = auVar70._0_4_;
  auVar39._0_4_ = auVar70._4_4_;
  auVar39._8_4_ = auVar70._12_4_;
  auVar39._12_4_ = auVar70._8_4_;
  auVar70 = minps(auVar39,auVar70);
  auVar87._0_8_ = auVar70._8_8_;
  auVar87._8_4_ = auVar70._0_4_;
  auVar87._12_4_ = auVar70._4_4_;
  auVar70 = minps(auVar87,auVar70);
  auVar72 = insertps(auVar72,auVar70,0x1c);
  auVar40._8_4_ = auVar32._8_4_;
  auVar40._0_8_ = auVar32._0_8_;
  auVar40._12_4_ = auVar32._12_4_;
  auVar13._4_4_ = fVar118;
  auVar13._0_4_ = fVar114;
  auVar13._8_4_ = fVar120;
  auVar13._12_4_ = fVar122;
  auVar70 = blendvps(_DAT_01f45a30,auVar13,auVar40);
  auVar41._4_4_ = auVar70._0_4_;
  auVar41._0_4_ = auVar70._4_4_;
  auVar41._8_4_ = auVar70._12_4_;
  auVar41._12_4_ = auVar70._8_4_;
  auVar70 = minps(auVar41,auVar70);
  auVar88._0_8_ = auVar70._8_8_;
  auVar88._8_4_ = auVar70._0_4_;
  auVar88._12_4_ = auVar70._4_4_;
  auVar70 = minps(auVar88,auVar70);
  auVar134 = insertps(auVar72,auVar70,0x20);
  auVar42._8_4_ = auVar32._8_4_;
  auVar42._0_8_ = auVar32._0_8_;
  auVar42._12_4_ = auVar32._12_4_;
  auVar70 = blendvps(_DAT_01f45a40,auVar135,auVar42);
  auVar43._4_4_ = auVar70._0_4_;
  auVar43._0_4_ = auVar70._4_4_;
  auVar43._8_4_ = auVar70._12_4_;
  auVar43._12_4_ = auVar70._8_4_;
  auVar70 = maxps(auVar43,auVar70);
  auVar110._0_8_ = auVar70._8_8_;
  auVar110._8_4_ = auVar70._0_4_;
  auVar110._12_4_ = auVar70._4_4_;
  auVar72 = maxps(auVar110,auVar70);
  auVar44._8_4_ = auVar32._8_4_;
  auVar44._0_8_ = auVar32._0_8_;
  auVar44._12_4_ = auVar32._12_4_;
  auVar70 = blendvps(_DAT_01f45a40,auVar31,auVar44);
  auVar45._4_4_ = auVar70._0_4_;
  auVar45._0_4_ = auVar70._4_4_;
  auVar45._8_4_ = auVar70._12_4_;
  auVar45._12_4_ = auVar70._8_4_;
  auVar70 = maxps(auVar45,auVar70);
  auVar94._0_8_ = auVar70._8_8_;
  auVar94._8_4_ = auVar70._0_4_;
  auVar94._12_4_ = auVar70._4_4_;
  auVar70 = maxps(auVar94,auVar70);
  auVar72 = insertps(auVar72,auVar70,0x1c);
  auVar46._8_4_ = auVar32._8_4_;
  auVar46._0_8_ = auVar32._0_8_;
  auVar46._12_4_ = auVar32._12_4_;
  auVar14._4_4_ = fVar118;
  auVar14._0_4_ = fVar114;
  auVar14._8_4_ = fVar120;
  auVar14._12_4_ = fVar122;
  auVar70 = blendvps(_DAT_01f45a40,auVar14,auVar46);
  auVar47._4_4_ = auVar70._0_4_;
  auVar47._0_4_ = auVar70._4_4_;
  auVar47._8_4_ = auVar70._12_4_;
  auVar47._12_4_ = auVar70._8_4_;
  auVar70 = maxps(auVar47,auVar70);
  auVar95._0_8_ = auVar70._8_8_;
  auVar95._8_4_ = auVar70._0_4_;
  auVar95._12_4_ = auVar70._4_4_;
  auVar70 = maxps(auVar95,auVar70);
  auVar123 = insertps(auVar72,auVar70,0x20);
  auVar48._8_4_ = auVar32._8_4_;
  auVar48._0_8_ = auVar32._0_8_;
  auVar48._12_4_ = auVar32._12_4_;
  auVar72 = blendvps(_DAT_01f45a30,auVar148,auVar48);
  auVar116._4_4_ = auVar72._0_4_;
  auVar116._0_4_ = auVar72._4_4_;
  auVar116._8_4_ = auVar72._12_4_;
  auVar116._12_4_ = auVar72._8_4_;
  auVar70 = blendvps(_DAT_01f45a40,local_10b8,auVar48);
  auVar129 = minps(auVar116,auVar72);
  auVar49._4_4_ = -(uint)(0.0 <= auVar134._4_4_);
  auVar49._0_4_ = -(uint)(0.0 <= auVar134._0_4_);
  auVar49._8_4_ = -(uint)(0.0 <= auVar134._8_4_);
  auVar49._12_4_ = -(uint)(0.0 <= auVar134._12_4_);
  auVar89 = blendvps(auVar123,auVar134,auVar49);
  auVar72 = blendvps(auVar73,auVar93,auVar49);
  auVar102._4_4_ = auVar70._0_4_;
  auVar102._0_4_ = auVar70._4_4_;
  auVar102._8_4_ = auVar70._12_4_;
  auVar102._12_4_ = auVar70._8_4_;
  auVar93 = blendvps(auVar93,auVar73,auVar49);
  auVar73 = maxps(auVar102,auVar70);
  local_fd8 = auVar89._0_4_;
  local_ff8 = auVar89._4_4_;
  uVar28 = (ulong)(local_ff8 < 0.0) << 4 | 0x20;
  fStack_fb0 = auVar89._8_4_;
  local_10d8._8_8_ = auVar73._8_8_;
  local_10d8._0_8_ = local_10d8._8_8_;
  uVar25 = (ulong)(fStack_fb0 < 0.0) << 4 | 0x40;
  if (auVar73._8_4_ <= auVar73._0_4_) {
    local_10d8._0_4_ = auVar73._0_4_;
  }
  auVar73 = blendvps(auVar134,auVar123,auVar49);
  local_fe8 = auVar72._0_4_ * local_fd8;
  local_1008 = auVar72._4_4_ * local_ff8;
  local_fc8 = auVar72._8_4_ * fStack_fb0;
  local_1148 = auVar93._0_4_;
  fStack_1144 = auVar93._4_4_;
  fStack_1140 = auVar93._8_4_;
  local_1018 = auVar73._0_4_;
  local_1028 = local_1148 * local_1018;
  local_1038 = auVar73._4_4_;
  local_1048 = fStack_1144 * local_1038;
  local_f98 = auVar73._8_4_;
  fStack_1140 = fStack_1140 * local_f98;
  uVar27 = (ulong)(local_fd8 < 0.0) * 0x10;
  stack[0].ptr.ptr = *(size_t *)&pAVar6[1].bounds.bounds0.lower.field_0;
  stack[0].dist = 0;
  fStack_fd4 = local_fd8;
  fStack_fd0 = local_fd8;
  fStack_fcc = local_fd8;
  fStack_fe4 = local_fe8;
  fStack_fe0 = local_fe8;
  fStack_fdc = local_fe8;
  fStack_ff4 = local_ff8;
  fStack_ff0 = local_ff8;
  fStack_fec = local_ff8;
  fStack_1004 = local_1008;
  fStack_1000 = local_1008;
  fStack_ffc = local_1008;
  local_fb8._4_4_ = fStack_fb0;
  local_fb8._0_4_ = fStack_fb0;
  fStack_fac = fStack_fb0;
  fStack_fc4 = local_fc8;
  fStack_fc0 = local_fc8;
  fStack_fbc = local_fc8;
  fStack_1014 = local_1018;
  fStack_1010 = local_1018;
  fStack_100c = local_1018;
  fStack_1024 = local_1028;
  fStack_1020 = local_1028;
  fStack_101c = local_1028;
  fStack_1034 = local_1038;
  fStack_1030 = local_1038;
  fStack_102c = local_1038;
  uVar22 = auVar129._0_4_;
  auVar117._8_4_ = auVar129._8_4_;
  auVar50._4_4_ = uVar22;
  auVar50._0_4_ = uVar22;
  auVar50._8_4_ = uVar22;
  auVar50._12_4_ = uVar22;
  auVar117._4_4_ = auVar117._8_4_;
  auVar117._0_4_ = auVar117._8_4_;
  auVar117._12_4_ = auVar117._8_4_;
  local_fa8 = minps(auVar117,auVar50);
  auVar72 = blendvps(_DAT_01f45a30,auVar148,auVar101);
  fStack_1044 = local_1048;
  fStack_1040 = local_1048;
  fStack_103c = local_1048;
  fStack_f94 = local_f98;
  fStack_f90 = local_f98;
  fStack_f8c = local_f98;
  pSVar29 = stack + 1;
LAB_007329b4:
  do {
    if (pSVar29 == stack) {
      if (uVar23 == 0) {
        return;
      }
      goto LAB_007325d9;
    }
    fVar53 = (float)pSVar29[-1].dist;
    pSVar29 = pSVar29 + -1;
    auVar58._4_4_ = fVar53;
    auVar58._0_4_ = fVar53;
    auVar58._8_4_ = fVar53;
    auVar58._12_4_ = fVar53;
    fVar52 = auVar70._0_4_;
    fVar103 = auVar70._4_4_;
    fVar105 = auVar70._8_4_;
    fVar107 = auVar70._12_4_;
    auVar74._4_4_ = -(uint)(fVar53 < fVar103);
    auVar74._0_4_ = -(uint)(fVar53 < fVar52);
    auVar74._8_4_ = -(uint)(fVar53 < fVar105);
    auVar74._12_4_ = -(uint)(fVar53 < fVar107);
    iVar17 = movmskps((int)stack,auVar74);
    if (iVar17 != 0) {
      uVar18 = (pSVar29->ptr).ptr;
      while( true ) {
        uVar16 = (uint)uVar18;
        if ((uVar18 & 8) != 0) {
          valid_leaf.field_0.i[1] = -(uint)(auVar58._4_4_ < fVar103);
          valid_leaf.field_0.i[0] = -(uint)(auVar58._0_4_ < fVar52);
          valid_leaf.field_0.i[2] = -(uint)(auVar58._8_4_ < fVar105);
          valid_leaf.field_0.i[3] = -(uint)(auVar58._12_4_ < fVar107);
          iVar17 = movmskps(uVar16,(undefined1  [16])valid_leaf.field_0);
          if (iVar17 != 0) {
            lVar21 = (ulong)(uVar16 & 0xf) - 8;
            prim = (Primitive_conflict4 *)(uVar18 & 0xfffffffffffffff0);
            while (bVar30 = lVar21 != 0, lVar21 = lVar21 + -1, bVar30) {
              valid_i = (vint<4> *)&valid_leaf;
              InstanceArrayIntersectorK<4>::intersect((vbool<4> *)valid_i,&pre,ray,context,prim);
              prim = prim + 1;
              auVar135 = local_1098;
              fVar136 = local_1058;
              fVar137 = fStack_1054;
              fVar138 = fStack_1050;
              fVar139 = fStack_104c;
              fVar140 = local_1068;
              fVar141 = fStack_1064;
              fVar142 = fStack_1060;
              fVar143 = fStack_105c;
              fVar144 = local_1078;
              fVar145 = fStack_1074;
              fVar146 = fStack_1070;
              fVar147 = fStack_106c;
              auVar31 = local_10a8;
              fVar114 = local_1088;
              fVar118 = fStack_1084;
              fVar120 = fStack_1080;
              fVar122 = fStack_107c;
            }
            auVar73 = *(undefined1 (*) [16])(ray + 0x80);
            auVar75._0_4_ = -(uint)(auVar73._0_4_ < fVar52) & valid_leaf.field_0._0_4_;
            auVar75._4_4_ = -(uint)(auVar73._4_4_ < fVar103) & valid_leaf.field_0._4_4_;
            auVar75._8_4_ = -(uint)(auVar73._8_4_ < fVar105) & valid_leaf.field_0._8_4_;
            auVar75._12_4_ = -(uint)(auVar73._12_4_ < fVar107) & valid_leaf.field_0._12_4_;
            iVar17 = movmskps((int)lVar21,auVar75);
            if (iVar17 != 0) {
              auVar70 = blendvps(auVar70,auVar73,(undefined1  [16])valid_leaf.field_0);
              auVar51._4_4_ = auVar70._0_4_;
              auVar51._0_4_ = auVar70._4_4_;
              auVar51._8_4_ = auVar70._12_4_;
              auVar51._12_4_ = auVar70._8_4_;
              auVar89 = maxps(auVar51,auVar70);
              auVar15._4_8_ = auVar73._8_8_;
              auVar15._0_4_ = auVar89._4_4_;
              auVar61._0_8_ = auVar15._0_8_ << 0x20;
              auVar61._8_4_ = auVar89._8_4_;
              auVar61._12_4_ = auVar89._12_4_;
              local_10d8._8_8_ = auVar89._8_8_;
              local_10d8._0_8_ = auVar61._8_8_;
              if (auVar89._8_4_ <= auVar89._0_4_) {
                local_10d8._0_4_ = auVar89._0_4_;
              }
            }
          }
          goto LAB_007329b4;
        }
        pfVar4 = (float *)(uVar18 + 0x20 + uVar27);
        fVar53 = *pfVar4 * local_fd8 - local_fe8;
        fVar62 = pfVar4[1] * fStack_fd4 - fStack_fe4;
        fVar64 = pfVar4[2] * fStack_fd0 - fStack_fe0;
        fVar66 = pfVar4[3] * fStack_fcc - fStack_fdc;
        pfVar4 = (float *)(uVar18 + 0x20 + uVar28);
        fVar68 = *pfVar4 * local_ff8 - local_1008;
        fVar76 = pfVar4[1] * fStack_ff4 - fStack_1004;
        fVar78 = pfVar4[2] * fStack_ff0 - fStack_1000;
        fVar80 = pfVar4[3] * fStack_fec - fStack_ffc;
        uVar69 = (uint)((int)fVar68 < (int)fVar53) * (int)fVar53 |
                 (uint)((int)fVar68 >= (int)fVar53) * (int)fVar68;
        uVar77 = (uint)((int)fVar76 < (int)fVar62) * (int)fVar62 |
                 (uint)((int)fVar76 >= (int)fVar62) * (int)fVar76;
        uVar79 = (uint)((int)fVar78 < (int)fVar64) * (int)fVar64 |
                 (uint)((int)fVar78 >= (int)fVar64) * (int)fVar78;
        uVar81 = (uint)((int)fVar80 < (int)fVar66) * (int)fVar66 |
                 (uint)((int)fVar80 >= (int)fVar66) * (int)fVar80;
        pfVar4 = (float *)(uVar18 + 0x20 + uVar25);
        fVar53 = *pfVar4 * (float)local_fb8._0_4_ - local_fc8;
        fVar62 = pfVar4[1] * (float)local_fb8._4_4_ - fStack_fc4;
        fVar64 = pfVar4[2] * fStack_fb0 - fStack_fc0;
        fVar66 = pfVar4[3] * fStack_fac - fStack_fbc;
        uVar54 = (uint)((int)fVar53 < (int)local_fa8._0_4_) * local_fa8._0_4_ |
                 (uint)((int)fVar53 >= (int)local_fa8._0_4_) * (int)fVar53;
        uVar63 = (uint)((int)fVar62 < (int)local_fa8._4_4_) * local_fa8._4_4_ |
                 (uint)((int)fVar62 >= (int)local_fa8._4_4_) * (int)fVar62;
        uVar65 = (uint)((int)fVar64 < (int)local_fa8._8_4_) * local_fa8._8_4_ |
                 (uint)((int)fVar64 >= (int)local_fa8._8_4_) * (int)fVar64;
        uVar67 = (uint)((int)fVar66 < (int)local_fa8._12_4_) * local_fa8._12_4_ |
                 (uint)((int)fVar66 >= (int)local_fa8._12_4_) * (int)fVar66;
        fmin.field_0.i[0] =
             ((int)uVar54 < (int)uVar69) * uVar69 | ((int)uVar54 >= (int)uVar69) * uVar54;
        fmin.field_0.i[1] =
             ((int)uVar63 < (int)uVar77) * uVar77 | ((int)uVar63 >= (int)uVar77) * uVar63;
        fmin.field_0.i[2] =
             ((int)uVar65 < (int)uVar79) * uVar79 | ((int)uVar65 >= (int)uVar79) * uVar65;
        fmin.field_0.i[3] =
             ((int)uVar67 < (int)uVar81) * uVar81 | ((int)uVar67 >= (int)uVar81) * uVar67;
        pfVar4 = (float *)(uVar18 + 0x20 + (uVar27 ^ 0x10));
        fVar53 = *pfVar4 * local_1018 - local_1028;
        fVar62 = pfVar4[1] * fStack_1014 - fStack_1024;
        fVar64 = pfVar4[2] * fStack_1010 - fStack_1020;
        fVar66 = pfVar4[3] * fStack_100c - fStack_101c;
        pfVar4 = (float *)(uVar18 + 0x20 + (uVar28 ^ 0x10));
        fVar68 = *pfVar4 * local_1038 - local_1048;
        fVar76 = pfVar4[1] * fStack_1034 - fStack_1044;
        fVar78 = pfVar4[2] * fStack_1030 - fStack_1040;
        fVar80 = pfVar4[3] * fStack_102c - fStack_103c;
        uVar69 = (uint)((int)fVar53 < (int)fVar68) * (int)fVar53 |
                 (uint)((int)fVar53 >= (int)fVar68) * (int)fVar68;
        uVar77 = (uint)((int)fVar62 < (int)fVar76) * (int)fVar62 |
                 (uint)((int)fVar62 >= (int)fVar76) * (int)fVar76;
        uVar79 = (uint)((int)fVar64 < (int)fVar78) * (int)fVar64 |
                 (uint)((int)fVar64 >= (int)fVar78) * (int)fVar78;
        uVar81 = (uint)((int)fVar66 < (int)fVar80) * (int)fVar66 |
                 (uint)((int)fVar66 >= (int)fVar80) * (int)fVar80;
        pfVar4 = (float *)(uVar18 + 0x20 + (uVar25 ^ 0x10));
        fVar53 = *pfVar4 * local_f98 - fStack_1140;
        fVar62 = pfVar4[1] * fStack_f94 - fStack_1140;
        fVar64 = pfVar4[2] * fStack_f90 - fStack_1140;
        fVar66 = pfVar4[3] * fStack_f8c - fStack_1140;
        uVar54 = (uint)((int)local_10d8._0_4_ < (int)fVar53) * local_10d8._0_4_ |
                 (uint)((int)local_10d8._0_4_ >= (int)fVar53) * (int)fVar53;
        uVar63 = (uint)((int)local_10d8._0_4_ < (int)fVar62) * local_10d8._0_4_ |
                 (uint)((int)local_10d8._0_4_ >= (int)fVar62) * (int)fVar62;
        uVar65 = (uint)((int)local_10d8._0_4_ < (int)fVar64) * local_10d8._0_4_ |
                 (uint)((int)local_10d8._0_4_ >= (int)fVar64) * (int)fVar64;
        uVar67 = (uint)((int)local_10d8._0_4_ < (int)fVar66) * local_10d8._0_4_ |
                 (uint)((int)local_10d8._0_4_ >= (int)fVar66) * (int)fVar66;
        auVar59._4_4_ =
             -(uint)(fmin.field_0.v[1] <=
                    (float)(((int)uVar77 < (int)uVar63) * uVar77 |
                           ((int)uVar77 >= (int)uVar63) * uVar63));
        auVar59._0_4_ =
             -(uint)(fmin.field_0.v[0] <=
                    (float)(((int)uVar69 < (int)uVar54) * uVar69 |
                           ((int)uVar69 >= (int)uVar54) * uVar54));
        auVar59._8_4_ =
             -(uint)(fmin.field_0.v[2] <=
                    (float)(((int)uVar79 < (int)uVar65) * uVar79 |
                           ((int)uVar79 >= (int)uVar65) * uVar65));
        auVar59._12_4_ =
             -(uint)(fmin.field_0.v[3] <=
                    (float)(((int)uVar81 < (int)uVar67) * uVar81 |
                           ((int)uVar81 >= (int)uVar67) * uVar67));
        uVar16 = movmskps(uVar16,auVar59);
        if (uVar16 == 0) break;
        uVar26 = (ulong)(uVar16 & 0xff);
        uVar24 = 0;
        uVar19 = 8;
        auVar58 = _DAT_01f45a30;
        do {
          lVar21 = 0;
          if (uVar26 != 0) {
            for (; (uVar26 >> lVar21 & 1) == 0; lVar21 = lVar21 + 1) {
            }
          }
          fVar53 = *(float *)(uVar18 + 0x20 + lVar21 * 4);
          fVar62 = *(float *)(uVar18 + 0x30 + lVar21 * 4);
          fVar64 = *(float *)(uVar18 + 0x40 + lVar21 * 4);
          fVar66 = *(float *)(uVar18 + 0x50 + lVar21 * 4);
          fVar91 = (fVar53 - fVar136) * auVar135._0_4_;
          fVar97 = (fVar53 - fVar137) * auVar135._4_4_;
          fVar98 = (fVar53 - fVar138) * auVar135._8_4_;
          fVar99 = (fVar53 - fVar139) * auVar135._12_4_;
          fVar100 = (fVar64 - fVar140) * auVar31._0_4_;
          fVar104 = (fVar64 - fVar141) * auVar31._4_4_;
          fVar106 = (fVar64 - fVar142) * auVar31._8_4_;
          fVar108 = (fVar64 - fVar143) * auVar31._12_4_;
          fVar53 = *(float *)(uVar18 + 0x60 + lVar21 * 4);
          fVar109 = (fVar53 - fVar144) * fVar114;
          fVar111 = (fVar53 - fVar145) * fVar118;
          fVar112 = (fVar53 - fVar146) * fVar120;
          fVar113 = (fVar53 - fVar147) * fVar122;
          fVar76 = (fVar62 - fVar136) * auVar135._0_4_;
          fVar78 = (fVar62 - fVar137) * auVar135._4_4_;
          fVar80 = (fVar62 - fVar138) * auVar135._8_4_;
          fVar90 = (fVar62 - fVar139) * auVar135._12_4_;
          fVar62 = (fVar66 - fVar140) * auVar31._0_4_;
          fVar64 = (fVar66 - fVar141) * auVar31._4_4_;
          fVar68 = (fVar66 - fVar142) * auVar31._8_4_;
          fVar66 = (fVar66 - fVar143) * auVar31._12_4_;
          fVar53 = *(float *)(uVar18 + 0x70 + lVar21 * 4);
          fVar115 = (fVar53 - fVar144) * fVar114;
          fVar119 = (fVar53 - fVar145) * fVar118;
          fVar121 = (fVar53 - fVar146) * fVar120;
          fVar53 = (fVar53 - fVar147) * fVar122;
          uVar16 = (uint)((int)fVar76 < (int)fVar91) * (int)fVar76 |
                   (uint)((int)fVar76 >= (int)fVar91) * (int)fVar91;
          uVar54 = (uint)((int)fVar78 < (int)fVar97) * (int)fVar78 |
                   (uint)((int)fVar78 >= (int)fVar97) * (int)fVar97;
          uVar63 = (uint)((int)fVar80 < (int)fVar98) * (int)fVar80 |
                   (uint)((int)fVar80 >= (int)fVar98) * (int)fVar98;
          uVar65 = (uint)((int)fVar90 < (int)fVar99) * (int)fVar90 |
                   (uint)((int)fVar90 >= (int)fVar99) * (int)fVar99;
          uVar67 = (uint)((int)fVar62 < (int)fVar100) * (int)fVar62 |
                   (uint)((int)fVar62 >= (int)fVar100) * (int)fVar100;
          uVar69 = (uint)((int)fVar64 < (int)fVar104) * (int)fVar64 |
                   (uint)((int)fVar64 >= (int)fVar104) * (int)fVar104;
          uVar77 = (uint)((int)fVar68 < (int)fVar106) * (int)fVar68 |
                   (uint)((int)fVar68 >= (int)fVar106) * (int)fVar106;
          uVar79 = (uint)((int)fVar66 < (int)fVar108) * (int)fVar66 |
                   (uint)((int)fVar66 >= (int)fVar108) * (int)fVar108;
          uVar128 = ((int)uVar67 < (int)uVar16) * uVar16 | ((int)uVar67 >= (int)uVar16) * uVar67;
          uVar131 = ((int)uVar69 < (int)uVar54) * uVar54 | ((int)uVar69 >= (int)uVar54) * uVar69;
          uVar132 = ((int)uVar77 < (int)uVar63) * uVar63 | ((int)uVar77 >= (int)uVar63) * uVar77;
          uVar133 = ((int)uVar79 < (int)uVar65) * uVar65 | ((int)uVar79 >= (int)uVar65) * uVar79;
          uVar16 = (uint)((int)fVar115 < (int)fVar109) * (int)fVar115 |
                   (uint)((int)fVar115 >= (int)fVar109) * (int)fVar109;
          uVar54 = (uint)((int)fVar119 < (int)fVar111) * (int)fVar119 |
                   (uint)((int)fVar119 >= (int)fVar111) * (int)fVar111;
          uVar63 = (uint)((int)fVar121 < (int)fVar112) * (int)fVar121 |
                   (uint)((int)fVar121 >= (int)fVar112) * (int)fVar112;
          uVar65 = (uint)((int)fVar53 < (int)fVar113) * (int)fVar53 |
                   (uint)((int)fVar53 >= (int)fVar113) * (int)fVar113;
          local_1138 = auVar72._0_4_;
          iStack_1134 = auVar72._4_4_;
          iStack_1130 = auVar72._8_4_;
          iStack_112c = auVar72._12_4_;
          uVar81 = (uint)((int)uVar16 < local_1138) * local_1138 |
                   ((int)uVar16 >= local_1138) * uVar16;
          uVar125 = (uint)((int)uVar54 < iStack_1134) * iStack_1134 |
                    ((int)uVar54 >= iStack_1134) * uVar54;
          uVar126 = (uint)((int)uVar63 < iStack_1130) * iStack_1130 |
                    ((int)uVar63 >= iStack_1130) * uVar63;
          uVar127 = (uint)((int)uVar65 < iStack_112c) * iStack_112c |
                    ((int)uVar65 >= iStack_112c) * uVar65;
          uVar67 = (uint)((int)fVar76 < (int)fVar91) * (int)fVar91 |
                   (uint)((int)fVar76 >= (int)fVar91) * (int)fVar76;
          uVar69 = (uint)((int)fVar78 < (int)fVar97) * (int)fVar97 |
                   (uint)((int)fVar78 >= (int)fVar97) * (int)fVar78;
          uVar77 = (uint)((int)fVar80 < (int)fVar98) * (int)fVar98 |
                   (uint)((int)fVar80 >= (int)fVar98) * (int)fVar80;
          uVar79 = (uint)((int)fVar90 < (int)fVar99) * (int)fVar99 |
                   (uint)((int)fVar90 >= (int)fVar99) * (int)fVar90;
          uVar16 = (uint)((int)fVar62 < (int)fVar100) * (int)fVar100 |
                   (uint)((int)fVar62 >= (int)fVar100) * (int)fVar62;
          uVar54 = (uint)((int)fVar64 < (int)fVar104) * (int)fVar104 |
                   (uint)((int)fVar64 >= (int)fVar104) * (int)fVar64;
          uVar63 = (uint)((int)fVar68 < (int)fVar106) * (int)fVar106 |
                   (uint)((int)fVar68 >= (int)fVar106) * (int)fVar68;
          uVar65 = (uint)((int)fVar66 < (int)fVar108) * (int)fVar108 |
                   (uint)((int)fVar66 >= (int)fVar108) * (int)fVar66;
          uVar16 = ((int)uVar67 < (int)uVar16) * uVar67 | ((int)uVar67 >= (int)uVar16) * uVar16;
          uVar54 = ((int)uVar69 < (int)uVar54) * uVar69 | ((int)uVar69 >= (int)uVar54) * uVar54;
          uVar63 = ((int)uVar77 < (int)uVar63) * uVar77 | ((int)uVar77 >= (int)uVar63) * uVar63;
          uVar65 = ((int)uVar79 < (int)uVar65) * uVar79 | ((int)uVar79 >= (int)uVar65) * uVar65;
          uVar67 = (uint)((int)fVar115 < (int)fVar109) * (int)fVar109 |
                   (uint)((int)fVar115 >= (int)fVar109) * (int)fVar115;
          uVar69 = (uint)((int)fVar119 < (int)fVar111) * (int)fVar111 |
                   (uint)((int)fVar119 >= (int)fVar111) * (int)fVar119;
          uVar77 = (uint)((int)fVar121 < (int)fVar112) * (int)fVar112 |
                   (uint)((int)fVar121 >= (int)fVar112) * (int)fVar121;
          uVar79 = (uint)((int)fVar53 < (int)fVar113) * (int)fVar113 |
                   (uint)((int)fVar53 >= (int)fVar113) * (int)fVar53;
          uVar67 = (uint)((int)fVar52 < (int)uVar67) * (int)fVar52 |
                   ((int)fVar52 >= (int)uVar67) * uVar67;
          uVar69 = (uint)((int)fVar103 < (int)uVar69) * (int)fVar103 |
                   ((int)fVar103 >= (int)uVar69) * uVar69;
          uVar77 = (uint)((int)fVar105 < (int)uVar77) * (int)fVar105 |
                   ((int)fVar105 >= (int)uVar77) * uVar77;
          uVar79 = (uint)((int)fVar107 < (int)uVar79) * (int)fVar107 |
                   ((int)fVar107 >= (int)uVar79) * uVar79;
          auVar124._4_4_ =
               -(uint)((float)(((int)uVar125 < (int)uVar131) * uVar131 |
                              ((int)uVar125 >= (int)uVar131) * uVar125) <=
                      (float)(((int)uVar54 < (int)uVar69) * uVar54 |
                             ((int)uVar54 >= (int)uVar69) * uVar69));
          auVar124._0_4_ =
               -(uint)((float)(((int)uVar81 < (int)uVar128) * uVar128 |
                              ((int)uVar81 >= (int)uVar128) * uVar81) <=
                      (float)(((int)uVar16 < (int)uVar67) * uVar16 |
                             ((int)uVar16 >= (int)uVar67) * uVar67));
          auVar124._8_4_ =
               -(uint)((float)(((int)uVar126 < (int)uVar132) * uVar132 |
                              ((int)uVar126 >= (int)uVar132) * uVar126) <=
                      (float)(((int)uVar63 < (int)uVar77) * uVar63 |
                             ((int)uVar63 >= (int)uVar77) * uVar77));
          auVar124._12_4_ =
               -(uint)((float)(((int)uVar127 < (int)uVar133) * uVar133 |
                              ((int)uVar127 >= (int)uVar133) * uVar127) <=
                      (float)(((int)uVar65 < (int)uVar79) * uVar65 |
                             ((int)uVar65 >= (int)uVar79) * uVar79));
          uVar16 = movmskps((int)valid_i,auVar124);
          valid_i = (vint<4> *)(ulong)uVar16;
          uVar20 = uVar19;
          if (uVar16 != 0) {
            fVar53 = *(float *)((long)&stack[-1].ptr.ptr + lVar21 * 4);
            auVar73 = ZEXT416((uint)fVar53);
            uVar20 = *(ulong *)(uVar18 + lVar21 * 8);
            auVar96._4_4_ = -(uint)(fVar53 < auVar58._4_4_);
            auVar96._0_4_ = -(uint)(fVar53 < auVar58._0_4_);
            auVar96._8_4_ = -(uint)(fVar53 < auVar58._8_4_);
            auVar96._12_4_ = -(uint)(fVar53 < auVar58._12_4_);
            uVar16 = movmskps(uVar16,auVar96);
            valid_i = (vint<4> *)(ulong)uVar16;
            if (uVar16 == 0) {
              (pSVar29->ptr).ptr = uVar20;
              uVar20 = uVar19;
              auVar60 = auVar58;
            }
            else {
              if (uVar19 == 8) {
                auVar58._8_4_ = fVar53;
                auVar58._0_8_ = CONCAT44(fVar53,fVar53);
                auVar58._12_4_ = fVar53;
                goto LAB_00732bf5;
              }
              (pSVar29->ptr).ptr = uVar19;
              auVar60._8_4_ = fVar53;
              auVar60._0_8_ = CONCAT44(fVar53,fVar53);
              auVar60._12_4_ = fVar53;
              auVar73 = auVar58;
            }
            auVar58 = auVar60;
            uVar24 = uVar24 + 1;
            pSVar29->dist = auVar73._0_4_;
            pSVar29 = pSVar29 + 1;
          }
LAB_00732bf5:
          uVar26 = uVar26 & uVar26 - 1;
          uVar19 = uVar20;
        } while (uVar26 != 0);
        if (uVar20 == 8) break;
        uVar18 = uVar20;
        if (1 < uVar24) {
          pSVar1 = pSVar29 + -2;
          valid_leaf.field_0.v[2] = (float)pSVar29[-2].dist;
          pSVar2 = pSVar29 + -1;
          if ((uint)valid_leaf.field_0.v[2] < pSVar29[-1].dist) {
            SVar5 = *pSVar1;
            pSVar29[-2].dist = pSVar29[-1].dist;
            (pSVar1->ptr).ptr = (pSVar2->ptr).ptr;
            valid_leaf.field_0._0_8_ = SVar5.ptr.ptr;
            (pSVar2->ptr).ptr = valid_leaf.field_0._0_8_;
            valid_leaf.field_0.i[2] = SVar5.dist;
            pSVar29[-1].dist = (uint)valid_leaf.field_0.v[2];
          }
          valid_i = (vint<4> *)(ulong)(uint)valid_leaf.field_0.i[2];
          if (uVar24 != 2) {
            pSVar3 = pSVar29 + -3;
            uVar16 = pSVar29[-3].dist;
            if (uVar16 < pSVar29[-1].dist) {
              SVar5 = *pSVar3;
              pSVar29[-3].dist = pSVar29[-1].dist;
              (pSVar3->ptr).ptr = (pSVar2->ptr).ptr;
              valid_leaf.field_0._0_8_ = SVar5.ptr.ptr;
              (pSVar2->ptr).ptr = valid_leaf.field_0._0_8_;
              valid_leaf.field_0.i[2] = SVar5.dist;
              pSVar29[-1].dist = (uint)valid_leaf.field_0.v[2];
              uVar16 = pSVar29[-3].dist;
            }
            valid_i = (vint<4> *)(ulong)uVar16;
            if (uVar16 < pSVar29[-2].dist) {
              SVar5 = *pSVar3;
              pSVar29[-3].dist = pSVar29[-2].dist;
              (pSVar3->ptr).ptr = (pSVar1->ptr).ptr;
              valid_leaf.field_0._0_8_ = SVar5.ptr.ptr;
              (pSVar1->ptr).ptr = valid_leaf.field_0._0_8_;
              valid_leaf.field_0.i[2] = SVar5.dist;
              pSVar29[-2].dist = (uint)valid_leaf.field_0.v[2];
            }
          }
        }
      }
    }
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersectCoherent(vint<K>* __restrict__ valid_i,
                                                                                                       Accel::Intersectors* __restrict__ This,
                                                                                                       RayHitK<K>& __restrict__ ray,
                                                                                                       RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* filter out invalid rays */
      vbool<K> valid = *valid_i == -1;
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      vint<K> octant = ray.octant();
      octant = select(valid, octant, vint<K>(0xffffffff));

      do
      {
        const size_t valid_index = bsf(valid_bits);
        const vbool<K> octant_valid = octant[valid_index] == octant;
        valid_bits &= ~(size_t)movemask(octant_valid);

        tray.tnear = select(octant_valid, org_ray_tnear, vfloat<K>(pos_inf));
        tray.tfar  = select(octant_valid, org_ray_tfar , vfloat<K>(neg_inf));

        Frustum<robust> frustum;
        frustum.template init<K>(octant_valid, tray.org, tray.rdir, tray.tnear, tray.tfar, N);

        StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
        StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
        stack[0].ptr  = bvh->root;
        stack[0].dist = neg_inf;

        while (1) pop:
        {
          /* pop next node from stack */
          if (unlikely(stackPtr == stack)) break;

          stackPtr--;
          NodeRef cur = NodeRef(stackPtr->ptr);

          /* cull node if behind closest hit point */
          vfloat<K> curDist = *(float*)&stackPtr->dist;
          const vbool<K> active = curDist < tray.tfar;
          if (unlikely(none(active))) continue;

          while (likely(!cur.isLeaf()))
          {
            /* process nodes */
            //STAT3(normal.trav_nodes, 1, popcnt(valid_node), K);
            const NodeRef nodeRef = cur;
            const AABBNode* __restrict__ const node = nodeRef.getAABBNode();

            vfloat<N> fmin;
            size_t m_frustum_node = intersectNodeFrustum<N>(node, frustum, fmin);

            if (unlikely(!m_frustum_node)) goto pop;
            cur = BVH::emptyNode;
            curDist = pos_inf;
            
#if defined(__AVX__)
            //STAT3(normal.trav_hit_boxes[popcnt(m_frustum_node)], 1, 1, 1);
#endif
            size_t num_child_hits = 0;
            do {
              const size_t i = bscf(m_frustum_node);
              vfloat<K> lnearP;
              vbool<K> lhit = false; // motion blur is not supported, so the initial value will be ignored
              STAT3(normal.trav_nodes, 1, 1, 1);
              BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

              if (likely(any(lhit)))
              {                                
                const vfloat<K> childDist = fmin[i];
                const NodeRef child = node->child(i);
                BVHN<N>::prefetch(child);
                if (any(childDist < curDist))
                {
                  if (likely(cur != BVH::emptyNode)) {
                    num_child_hits++;
                    stackPtr->ptr = cur;
                    *(float*)&stackPtr->dist = toScalar(curDist);
                    stackPtr++;
                  }
                  curDist = childDist;
                  cur = child;
                }
                /* push hit child onto stack */
                else {
                  num_child_hits++;
                  stackPtr->ptr = child;
                  *(float*)&stackPtr->dist = toScalar(childDist);
                  stackPtr++;
                }                
              }
            } while(m_frustum_node);

            if (unlikely(cur == BVH::emptyNode)) goto pop;

            /* improved distance sorting for 3 or more hits */
            if (unlikely(num_child_hits >= 2))
            {
              if (stackPtr[-2].dist < stackPtr[-1].dist)
                std::swap(stackPtr[-2],stackPtr[-1]);
              if (unlikely(num_child_hits >= 3))
              {
                if (stackPtr[-3].dist < stackPtr[-1].dist)
                  std::swap(stackPtr[-3],stackPtr[-1]);
                if (stackPtr[-3].dist < stackPtr[-2].dist)
                  std::swap(stackPtr[-3],stackPtr[-2]);
              }
            }
          }

          /* intersect leaf */
          assert(cur != BVH::invalidNode);
          assert(cur != BVH::emptyNode);
          const vbool<K> valid_leaf = tray.tfar > curDist;
          STAT3(normal.trav_leaves, 1, popcnt(valid_leaf), K);
          if (unlikely(none(valid_leaf))) continue;
          size_t items; const Primitive* prim = (Primitive*)cur.leaf(items);

          size_t lazy_node = 0;
          PrimitiveIntersectorK::intersect(valid_leaf, This, pre, ray, context, prim, items, tray, lazy_node);

          /* reduce max distance interval on successful intersection */
          if (likely(any((ray.tfar < tray.tfar) & valid_leaf)))
          {
            tray.tfar = select(valid_leaf, ray.tfar, tray.tfar);
            frustum.template updateMaxDist<K>(tray.tfar);
          }

          if (unlikely(lazy_node)) {
            stackPtr->ptr = lazy_node;
            stackPtr->dist = neg_inf;
            stackPtr++;
          }
        }
        
      } while(valid_bits);
    }